

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O2

Am_Wrapper * __thiscall Part_Key_Offset_Store_Data::Make_Unique(Part_Key_Offset_Store_Data *this)

{
  Part_Key_Offset_Store_Data *this_00;
  
  this_00 = this;
  if ((this->super_Am_Wrapper).refs != 1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_00 = (Part_Key_Offset_Store_Data *)operator_new(0x18);
    Part_Key_Offset_Store_Data(this_00,this);
  }
  return &this_00->super_Am_Wrapper;
}

Assistant:

static Am_Value
offset_from_part_procedure(Am_Object &self)
{
  Am_Value value;
  Part_Key_Offset_Store_Data *store =
      (Part_Key_Offset_Store_Data *)Am_Object_Advanced::Get_Context()
          ->Get_Data();
  value = self.Get_Object(store->part).Get(store->key);
  store->Release();
  modify_value(value, store->offset, store->multiplier);
  return value;
}